

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O1

void stringcache_destroy(StringCache *cache)

{
  MOJOSHADER_free UNRECOVERED_JUMPTABLE;
  void *pvVar1;
  StringBucket *pSVar2;
  StringBucket *pSVar3;
  ulong uVar4;
  
  if (cache == (StringCache *)0x0) {
    return;
  }
  UNRECOVERED_JUMPTABLE = cache->f;
  pvVar1 = cache->d;
  if (cache->table_size != 0) {
    uVar4 = 0;
    do {
      pSVar2 = cache->hashtable[uVar4];
      cache->hashtable[uVar4] = (StringBucket *)0x0;
      while (pSVar2 != (StringBucket *)0x0) {
        pSVar3 = pSVar2->next;
        (*UNRECOVERED_JUMPTABLE)(pSVar2,pvVar1);
        pSVar2 = pSVar3;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < cache->table_size);
  }
  (*UNRECOVERED_JUMPTABLE)(cache->hashtable,pvVar1);
  (*UNRECOVERED_JUMPTABLE)(cache,pvVar1);
  return;
}

Assistant:

void stringcache_destroy(StringCache *cache)
{
    if (cache == NULL)
        return;

    MOJOSHADER_free f = cache->f;
    void *d = cache->d;
    size_t i;

    for (i = 0; i < cache->table_size; i++)
    {
        StringBucket *bucket = cache->hashtable[i];
        cache->hashtable[i] = NULL;
        while (bucket)
        {
            StringBucket *next = bucket->next;
            f(bucket, d);
            bucket = next;
        } // while
    } // for

    f(cache->hashtable, d);
    f(cache, d);
}